

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode curl_url_get(CURLU *u,CURLUPart what,char **part,uint flags)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  CURLcode CVar4;
  char *plus;
  Curl_handler *pCVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  CURLUcode CVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *scheme;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  uint uVar20;
  char *pcVar21;
  uint uVar22;
  char *pcVar23;
  char *pcVar24;
  bool bVar25;
  bool bVar26;
  char portbuf [7];
  char *decoded;
  size_t dlen;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char **)0x0) {
    return CURLUE_BAD_PARTPOINTER;
  }
  *part = (char *)0x0;
  if (CURLUPART_ZONEID < what) {
    return CURLUE_UNKNOWN_PART;
  }
  uVar20 = flags >> 6 & 3;
  switch(what) {
  case CURLUPART_URL:
    pcVar6 = u->options;
    pcVar10 = u->port;
    if ((u->scheme == (char *)0x0) || (iVar3 = Curl_strcasecompare("file",u->scheme), iVar3 == 0)) {
      if (u->host == (char *)0x0) {
        return CURLUE_NO_HOST;
      }
      scheme = u->scheme;
      if (scheme == (char *)0x0) {
        if ((flags & 4) == 0) {
          return CURLUE_NO_SCHEME;
        }
        scheme = "https";
      }
      pCVar5 = Curl_builtin_scheme(scheme);
      if ((flags & 1) == 0 || pcVar10 != (char *)0x0) {
        if (pCVar5 == (Curl_handler *)0x0 || pcVar10 == (char *)0x0) {
          if (pCVar5 == (Curl_handler *)0x0) goto LAB_004163bf;
        }
        else {
          pcVar9 = (char *)0x0;
          if (pCVar5->defport != u->portnum) {
            pcVar9 = pcVar10;
          }
          if ((flags & 2) != 0) {
            pcVar10 = pcVar9;
          }
        }
LAB_004163ad:
        if ((pCVar5->flags & 0x400) == 0) {
          pcVar6 = (char *)0x0;
        }
      }
      else {
        if (pCVar5 != (Curl_handler *)0x0) {
          curl_msnprintf(portbuf,7,"%ld",pCVar5->defport);
          pcVar10 = portbuf;
          goto LAB_004163ad;
        }
        pcVar10 = (char *)0x0;
      }
LAB_004163bf:
      if ((*u->host == '[') && (pcVar9 = u->zoneid, pcVar9 != (char *)0x0)) {
        sVar7 = strlen(u->host);
        sVar8 = strlen(pcVar9);
        pcVar9 = (char *)(*Curl_cmalloc)(sVar8 + sVar7 + 4);
        if (pcVar9 == (char *)0x0) {
          return CURLUE_OUT_OF_MEMORY;
        }
        memcpy(pcVar9,u->host,sVar7 - 1);
        curl_msnprintf(pcVar9 + (sVar7 - 1),sVar8 + 5,"%%25%s]",u->zoneid);
      }
      else {
        pcVar9 = (char *)0x0;
      }
      pcVar16 = u->password;
      bVar25 = pcVar16 == (char *)0x0;
      pcVar1 = "    :";
      pcVar2 = "    :";
      if (bVar25) {
        pcVar2 = "PK\x01\x02";
        pcVar16 = "";
      }
      bVar26 = pcVar6 == (char *)0x0;
      pcVar17 = ";";
      if (bVar26) {
        pcVar17 = "";
        pcVar6 = "";
      }
      pcVar19 = "@";
      if (bVar26) {
        pcVar19 = "";
      }
      if (!bVar25) {
        pcVar19 = "@";
      }
      pcVar11 = u->user;
      if (pcVar11 == (char *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar19 = "@";
      }
      pcVar14 = pcVar9;
      if (pcVar9 == (char *)0x0) {
        pcVar14 = u->host;
      }
      if (pcVar10 == (char *)0x0) {
        pcVar1 = "PK\x01\x02";
        pcVar10 = "";
      }
      pcVar13 = u->path;
      if (pcVar13 == (char *)0x0) {
        pcVar13 = "/";
        pcVar21 = "";
      }
      else {
        pcVar21 = "/";
        if (*pcVar13 == '/') {
          pcVar21 = "";
        }
      }
      pcVar24 = u->query;
      pcVar23 = "";
      pcVar15 = "";
      if ((pcVar24 != (char *)0x0) && (pcVar23 = "?", pcVar15 = pcVar24, *pcVar24 == '\0')) {
        pcVar23 = "";
        pcVar15 = "";
      }
      pcVar24 = u->fragment;
      pcVar18 = "#";
      if (pcVar24 == (char *)0x0) {
        pcVar18 = "";
        pcVar24 = "";
      }
      pcVar6 = curl_maprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",scheme,pcVar11,pcVar2 + 4,pcVar16
                             ,pcVar17,pcVar6,pcVar19,pcVar14,pcVar1 + 4,pcVar10,pcVar21,pcVar13,
                             pcVar23,pcVar15,pcVar18,pcVar24);
      (*Curl_cfree)(pcVar9);
    }
    else {
      pcVar6 = u->fragment;
      pcVar10 = "#";
      if (pcVar6 == (char *)0x0) {
        pcVar10 = "";
        pcVar6 = "";
      }
      pcVar6 = curl_maprintf("file://%s%s%s",u->path,pcVar10,pcVar6);
    }
    if (pcVar6 == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    *part = pcVar6;
    goto LAB_00416592;
  case CURLUPART_SCHEME:
    CVar12 = CURLUE_NO_SCHEME;
    uVar22 = 0;
    uVar20 = 0;
    goto LAB_0041621d;
  case CURLUPART_USER:
    u = (CURLU *)&u->user;
    CVar12 = CURLUE_NO_USER;
    break;
  case CURLUPART_PASSWORD:
    u = (CURLU *)&u->password;
    CVar12 = CURLUE_NO_PASSWORD;
    break;
  case CURLUPART_OPTIONS:
    u = (CURLU *)&u->options;
    CVar12 = CURLUE_NO_OPTIONS;
    break;
  case CURLUPART_HOST:
    u = (CURLU *)&u->host;
    CVar12 = CURLUE_NO_HOST;
    break;
  case CURLUPART_PORT:
    pcVar6 = u->port;
    if ((flags & 1) != 0 && pcVar6 == (char *)0x0) {
      if (u->scheme == (char *)0x0) {
        return CURLUE_NO_PORT;
      }
      pCVar5 = Curl_builtin_scheme(u->scheme);
      if (pCVar5 == (Curl_handler *)0x0) {
        return CURLUE_NO_PORT;
      }
      uVar20 = 0;
      pcVar6 = portbuf;
      curl_msnprintf(pcVar6,7,"%ld",pCVar5->defport);
      goto LAB_004162ae;
    }
    if (pcVar6 == (char *)0x0) {
      return CURLUE_NO_PORT;
    }
    if ((u->scheme == (char *)0x0) ||
       (pCVar5 = Curl_builtin_scheme(u->scheme), pCVar5 == (Curl_handler *)0x0)) {
      uVar20 = 0;
      goto LAB_004162ae;
    }
    uVar20 = 0;
    if ((flags & 2) == 0) goto LAB_004162ae;
    uVar22 = 0;
    if (pCVar5->defport == u->portnum) {
      return CURLUE_NO_PORT;
    }
    goto LAB_004162b1;
  case CURLUPART_PATH:
    pcVar6 = u->path;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (*Curl_cstrdup)("/");
      u->path = pcVar6;
      if (pcVar6 == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
    }
LAB_004162ae:
    uVar22 = 0;
    goto LAB_004162b1;
  case CURLUPART_QUERY:
    u = (CURLU *)&u->query;
    CVar12 = CURLUE_NO_QUERY;
    uVar22 = uVar20;
    goto LAB_0041621d;
  case CURLUPART_FRAGMENT:
    u = (CURLU *)&u->fragment;
    CVar12 = CURLUE_NO_FRAGMENT;
    break;
  case CURLUPART_ZONEID:
    u = (CURLU *)&u->zoneid;
    CVar12 = CURLUE_UNKNOWN_PART;
  }
  uVar22 = 0;
LAB_0041621d:
  pcVar6 = u->scheme;
  if (pcVar6 != (char *)0x0) {
LAB_004162b1:
    pcVar6 = (*Curl_cstrdup)(pcVar6);
    *part = pcVar6;
    CVar12 = CURLUE_OUT_OF_MEMORY;
    if (pcVar6 != (char *)0x0) {
      if ((uVar22 & 1) != 0) {
        do {
          if (*pcVar6 == '+') {
            *pcVar6 = ' ';
          }
          else if (*pcVar6 == '\0') break;
          pcVar6 = pcVar6 + 1;
        } while( true );
      }
      if ((uVar20 & 1) != 0) {
        CVar4 = Curl_urldecode((Curl_easy *)0x0,*part,0,&decoded,&dlen,true);
        (*Curl_cfree)(*part);
        pcVar6 = (char *)0x0;
        if (CVar4 == CURLE_OK) {
          pcVar6 = decoded;
        }
        *part = pcVar6;
        if (CVar4 != CURLE_OK) {
          return CURLUE_URLDECODE;
        }
      }
LAB_00416592:
      CVar12 = CURLUE_OK;
    }
  }
  return CVar12;
}

Assistant:

CURLUcode curl_url_get(CURLU *u, CURLUPart what,
                       char **part, unsigned int flags)
{
  char *ptr;
  CURLUcode ifmissing = CURLUE_UNKNOWN_PART;
  char portbuf[7];
  bool urldecode = (flags & CURLU_URLDECODE)?1:0;
  bool plusdecode = FALSE;
  (void)flags;
  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part)
    return CURLUE_BAD_PARTPOINTER;
  *part = NULL;

  switch(what) {
  case CURLUPART_SCHEME:
    ptr = u->scheme;
    ifmissing = CURLUE_NO_SCHEME;
    urldecode = FALSE; /* never for schemes */
    break;
  case CURLUPART_USER:
    ptr = u->user;
    ifmissing = CURLUE_NO_USER;
    break;
  case CURLUPART_PASSWORD:
    ptr = u->password;
    ifmissing = CURLUE_NO_PASSWORD;
    break;
  case CURLUPART_OPTIONS:
    ptr = u->options;
    ifmissing = CURLUE_NO_OPTIONS;
    break;
  case CURLUPART_HOST:
    ptr = u->host;
    ifmissing = CURLUE_NO_HOST;
    break;
  case CURLUPART_ZONEID:
    ptr = u->zoneid;
    break;
  case CURLUPART_PORT:
    ptr = u->port;
    ifmissing = CURLUE_NO_PORT;
    urldecode = FALSE; /* never for port */
    if(!ptr && (flags & CURLU_DEFAULT_PORT) && u->scheme) {
      /* there's no stored port number, but asked to deliver
         a default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme);
      if(h) {
        msnprintf(portbuf, sizeof(portbuf), "%ld", h->defport);
        ptr = portbuf;
      }
    }
    else if(ptr && u->scheme) {
      /* there is a stored port number, but ask to inhibit if
         it matches the default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme);
      if(h && (h->defport == u->portnum) &&
         (flags & CURLU_NO_DEFAULT_PORT))
        ptr = NULL;
    }
    break;
  case CURLUPART_PATH:
    ptr = u->path;
    if(!ptr) {
      ptr = u->path = strdup("/");
      if(!u->path)
        return CURLUE_OUT_OF_MEMORY;
    }
    break;
  case CURLUPART_QUERY:
    ptr = u->query;
    ifmissing = CURLUE_NO_QUERY;
    plusdecode = urldecode;
    break;
  case CURLUPART_FRAGMENT:
    ptr = u->fragment;
    ifmissing = CURLUE_NO_FRAGMENT;
    break;
  case CURLUPART_URL: {
    char *url;
    char *scheme;
    char *options = u->options;
    char *port = u->port;
    char *allochost = NULL;
    if(u->scheme && strcasecompare("file", u->scheme)) {
      url = aprintf("file://%s%s%s",
                    u->path,
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
    }
    else if(!u->host)
      return CURLUE_NO_HOST;
    else {
      const struct Curl_handler *h = NULL;
      if(u->scheme)
        scheme = u->scheme;
      else if(flags & CURLU_DEFAULT_SCHEME)
        scheme = (char *) DEFAULT_SCHEME;
      else
        return CURLUE_NO_SCHEME;

      if(scheme) {
        h = Curl_builtin_scheme(scheme);
        if(!port && (flags & CURLU_DEFAULT_PORT)) {
          /* there's no stored port number, but asked to deliver
             a default one for the scheme */
          if(h) {
            msnprintf(portbuf, sizeof(portbuf), "%ld", h->defport);
            port = portbuf;
          }
        }
        else if(port) {
          /* there is a stored port number, but asked to inhibit if it matches
             the default one for the scheme */
          if(h && (h->defport == u->portnum) &&
             (flags & CURLU_NO_DEFAULT_PORT))
            port = NULL;
        }
      }
      if(h && !(h->flags & PROTOPT_URLOPTIONS))
        options = NULL;

      if((u->host[0] == '[') && u->zoneid) {
        /* make it '[ host %25 zoneid ]' */
        size_t hostlen = strlen(u->host);
        size_t alen = hostlen + 3 + strlen(u->zoneid) + 1;
        allochost = malloc(alen);
        if(!allochost)
          return CURLUE_OUT_OF_MEMORY;
        memcpy(allochost, u->host, hostlen - 1);
        msnprintf(&allochost[hostlen - 1], alen - hostlen + 1,
                  "%%25%s]", u->zoneid);
      }

      url = aprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",
                    scheme,
                    u->user ? u->user : "",
                    u->password ? ":": "",
                    u->password ? u->password : "",
                    options ? ";" : "",
                    options ? options : "",
                    (u->user || u->password || options) ? "@": "",
                    allochost ? allochost : u->host,
                    port ? ":": "",
                    port ? port : "",
                    (u->path && (u->path[0] != '/')) ? "/": "",
                    u->path ? u->path : "/",
                    (u->query && u->query[0]) ? "?": "",
                    (u->query && u->query[0]) ? u->query : "",
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
      free(allochost);
    }
    if(!url)
      return CURLUE_OUT_OF_MEMORY;
    *part = url;
    return CURLUE_OK;
  }
  default:
    ptr = NULL;
    break;
  }
  if(ptr) {
    *part = strdup(ptr);
    if(!*part)
      return CURLUE_OUT_OF_MEMORY;
    if(plusdecode) {
      /* convert + to space */
      char *plus;
      for(plus = *part; *plus; ++plus) {
        if(*plus == '+')
          *plus = ' ';
      }
    }
    if(urldecode) {
      char *decoded;
      size_t dlen;
      CURLcode res = Curl_urldecode(NULL, *part, 0, &decoded, &dlen, TRUE);
      free(*part);
      if(res) {
        *part = NULL;
        return CURLUE_URLDECODE;
      }
      *part = decoded;
    }
    return CURLUE_OK;
  }
  else
    return ifmissing;
}